

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::operator[](Value *this,char *key)

{
  iterator iVar1;
  runtime_error *this_00;
  undefined1 *puVar2;
  CZString actualKey;
  
  if (this->field_0x8 == '\0') {
    puVar2 = kNull;
  }
  else {
    if (this->field_0x8 != '\a') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"in Json::Value::operator[](char const*)const: requires objectValue");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    actualKey.index_ = 0;
    actualKey.cstr_ = key;
    iVar1 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,&actualKey);
    puVar2 = kNull;
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
      puVar2 = (undefined1 *)&iVar1._M_node[1]._M_left;
    }
    CZString::~CZString(&actualKey);
  }
  return (Value *)puVar2;
}

Assistant:

const Value& Value::operator[](const char* key) const {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::operator[](char const*)const: requires objectValue");
  if (type_ == nullValue)
    return null;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  CZString actualKey(key, CZString::noDuplication);
  ObjectValues::const_iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end())
    return null;
  return (*it).second;
#else
  const Value* value = value_.map_->find(key);
  return value ? *value : null;
#endif
}